

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::anon_unknown_0::GetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  FeatureSet parent;
  StatusOr<google::protobuf::FeatureResolver> resolver;
  FeatureSet child;
  FeatureSet local_108;
  StatusOrData<google::protobuf::FeatureResolver> local_b8;
  FeatureSet local_60;
  
  FeatureResolver::Create((StatusOr<google::protobuf::FeatureResolver> *)&local_b8,edition,defaults)
  ;
  absl::lts_20250127::Status::Status((Status *)&local_108,(Status *)&local_b8);
  if (local_108.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
    absl::lts_20250127::Status::~Status((Status *)&local_108);
    FeatureSet::FeatureSet(&local_108);
    FeatureSet::FeatureSet(&local_60);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::EnsureOk
              (&local_b8);
    FeatureResolver::MergeFeatures
              (__return_storage_ptr__,&local_b8.field_1.data_,&local_108,&local_60);
    FeatureSet::~FeatureSet(&local_60);
    FeatureSet::~FeatureSet(&local_108);
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,
               (Status *)&local_108);
    absl::lts_20250127::Status::~Status((Status *)&local_108);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> GetDefaults(Edition edition,
                                       const FeatureSetDefaults& defaults) {
  absl::StatusOr<FeatureResolver> resolver =
      FeatureResolver::Create(edition, defaults);
  RETURN_IF_ERROR(resolver.status());
  FeatureSet parent, child;
  return resolver->MergeFeatures(parent, child);
}